

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O0

void nhr_response_parse_content_encoding(nhr_response r,char *received)

{
  char *pcVar1;
  char *pcVar2;
  char *encoding;
  char *received_local;
  nhr_response r_local;
  
  pcVar1 = nhr_response_find_http_field_value(received,"Content-Encoding");
  if (pcVar1 != (char *)0x0) {
    pcVar2 = strstr(pcVar1,"gzip");
    if (pcVar2 != (char *)0x0) {
      r->content_encoding = r->content_encoding | 1;
    }
    pcVar1 = strstr(pcVar1,"deflate");
    if (pcVar1 != (char *)0x0) {
      r->content_encoding = r->content_encoding | 2;
    }
  }
  return;
}

Assistant:

void nhr_response_parse_content_encoding(nhr_response r, char * received) {
	char * encoding = nhr_response_find_http_field_value(received, k_nhr_content_encoding);
	if (!encoding) {
		return;
	}

	if (strstr(encoding, k_nhr_gzip)) {
#if defined(NHR_GZIP)
		r->content_encoding |= NHR_CONTENT_ENCODING_GZIP;
#else
		nhr_response_log_unprocessed(k_nhr_transfer_encoding, encoding);
#endif
	}
	if (strstr(encoding, k_nhr_deflate)) {
#if defined(NHR_GZIP)
		r->content_encoding |= NHR_CONTENT_ENCODING_DEFLATE;
#else
		nhr_response_log_unprocessed(k_nhr_transfer_encoding, encoding);
#endif
	}
}